

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall
MakefileGenerator::writeInstalls(MakefileGenerator *this,QTextStream *t,bool noBuild)

{
  ProStringList l;
  QString file;
  QString file_00;
  QString file_01;
  undefined1 auVar1 [8];
  QHash<QString,_QMakeLocalFileName> QVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  ProStringList *pPVar11;
  QList<ProString> *vector;
  qsizetype qVar12;
  ProStringList *pPVar13;
  QArrayDataPointer<ProString> *other;
  iterator in;
  iterator iVar14;
  QLatin1String *pQVar15;
  pointer pQVar16;
  QMakeProject *pQVar17;
  QTextStream *pQVar18;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  str;
  MakefileGenerator *pMVar19;
  char *pcVar20;
  MakefileGenerator *pMVar21;
  MakefileGenerator *pMVar22;
  QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *a_;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
  *this_00;
  ProString *pPVar23;
  QString *pQVar24;
  ProString *this_01;
  ulong uVar25;
  long lVar26;
  QMakeProject *pQVar27;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  this_02;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffae0;
  char in_stack_fffffffffffffae7;
  long local_500;
  QStringBuilder<QString_&,_QString_&> local_4d8;
  QFileInfo fi;
  QArrayDataPointer<char16_t> local_4b0;
  QArrayDataPointer<char16_t> local_498;
  QFileInfo fi_1;
  QArrayDataPointer<char16_t> local_478;
  QArrayDataPointer<char16_t> local_460;
  QArrayDataPointer<char16_t> local_448;
  undefined1 local_430 [24];
  ProKey local_418;
  QArrayDataPointer<char16_t> local_3e0;
  undefined1 local_3c8 [32];
  QArrayDataPointer<char16_t> local_3a8;
  QArrayDataPointer<char16_t> local_388;
  undefined1 local_370 [24];
  undefined1 local_358 [8];
  Data *pDStack_350;
  QMakeLocalFileName *local_348;
  QArrayDataPointer<QString> local_338;
  QArrayDataPointer<char16_t> local_318;
  QArrayDataPointer<char16_t> local_2f8;
  QArrayDataPointer<char16_t> local_2e0;
  undefined1 local_2c8 [8];
  QMakeProject *pQStack_2c0;
  QHash<QString,_QMakeLocalFileName> local_2b8;
  QArrayDataPointer<char16_t> local_2a8;
  QArrayDataPointer<char16_t> local_288;
  QArrayDataPointer<ProString> local_270;
  QArrayDataPointer<ProString> local_258;
  QArrayDataPointer<QString> local_238;
  QArrayDataPointer<QString> local_218;
  QArrayDataPointer<QString> local_1f8;
  QArrayDataPointer<char16_t> local_1d8;
  QArrayDataPointer<char16_t> local_1b8;
  ProKey pvar;
  undefined1 local_168 [16];
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  undefined1 local_118 [16];
  ProFile *local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  QMakeProject *pQStack_d8;
  QMakeProject *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Data *local_a8;
  char16_t *local_a0;
  char (*local_98) [4];
  undefined1 local_88 [16];
  QArrayDataPointer<char16_t> local_78 [2];
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  local_108 = (ProFile *)0xaaaaaaaaaaaaaaaa;
  local_118._0_8_ = (QMakeEvaluator *)0xaaaaaaaaaaaaaaaa;
  local_118._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)local_118,"-$(DEL_FILE)");
  bVar8 = isWindowsShell(this);
  if (!bVar8) {
    QString::operator=((QString *)local_118,"-$(DEL_FILE) -r");
  }
  local_138.size = 0;
  local_138.d = (Data *)0x0;
  local_138.ptr = (char16_t *)0x0;
  local_158.d = (Data *)0x0;
  local_158.ptr = (char16_t *)0x0;
  local_158.size = 0;
  local_168._8_8_ = (char16_t *)0x0;
  local_168._0_8_ = (Data *)0x0;
  pQVar27 = this->project;
  ProKey::ProKey((ProKey *)local_88,"INSTALLS");
  pPVar11 = QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  this_02.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(pPVar11->super_QList<ProString>).d.ptr;
  do {
    if (this_02.d.ptr ==
        (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)((pPVar11->super_QList<ProString>).d.ptr + (pPVar11->super_QList<ProString>).d.size)) {
      pQVar18 = (QTextStream *)QTextStream::operator<<(t,"install:");
      ProKey::ProKey((ProKey *)local_88,"INSTALLDEPS");
      depVar((QString *)&pvar,this,(ProKey *)local_88);
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&pvar);
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,' ');
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_138);
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18," FORCE\n\nuninstall: ");
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)&local_158);
      ProKey::ProKey((ProKey *)local_c8,"UNINSTALLDEPS");
      depVar((QString *)local_f8,this,(ProKey *)local_c8);
      pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)local_f8);
      QTextStream::operator<<(pQVar18," FORCE\n\n");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pvar);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)local_168);
      QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)(local_168 + 8));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
      if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pvar.super_ProString.m_file = -0x55555556;
    pvar.super_ProString._36_4_ = 0xaaaaaaaa;
    pvar.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    pvar.super_ProString.m_string.d.size = -0x5555555555555556;
    pvar.super_ProString.m_offset = -0x55555556;
    pvar.super_ProString.m_length = -0x55555556;
    pvar.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    pvar.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_88._8_8_ = ".path";
    local_88._0_8_ = this_02.d.ptr;
    ProString::ProString<ProString_const&,char_const(&)[6]>
              (&pvar.super_ProString,
               (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_88);
    pQVar27 = this->project;
    local_c8._8_8_ = ".CONFIG";
    local_c8._0_8_ = this_02.d.ptr;
    ProString::ProString<ProString_const&,char_const(&)[8]>
              ((ProString *)local_88,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_c8);
    vector = &QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88)->
              super_QList<ProString>;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    qVar12 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
    if (((qVar12 == -1) &&
        (qVar12 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0),
        qVar12 == -1)) &&
       (pPVar13 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,&pvar),
       (pPVar13->super_QList<ProString>).d.size == 0)) {
      ProString::toLatin1((QByteArray *)local_88,&pvar.super_ProString);
      pQVar27 = (QMakeProject *)local_88._8_8_;
      if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
        pQVar27 = (QMakeProject *)&QByteArray::_empty;
      }
      warn_msg(WarnLogic,"%s is not defined: install target not created\n",pQVar27);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_88);
    }
    else {
      local_1b8.size = -0x5555555555555556;
      local_1b8.d._0_4_ = 0xaaaaaaaa;
      local_1b8.d._4_4_ = 0xaaaaaaaa;
      local_1b8.ptr._0_4_ = 0xaaaaaaaa;
      local_1b8.ptr._4_4_ = 0xaaaaaaaa;
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x13])(&local_1b8);
      local_1d8.d = (Data *)0x0;
      local_1d8.ptr = (char16_t *)0x0;
      local_1d8.size = 0;
      qVar12 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"no_path",0);
      pMVar22 = this;
      if ((qVar12 == -1) &&
         (qVar12 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0),
         pMVar22 = this, qVar12 == -1)) {
        QMakeEvaluator::first((ProString *)local_88,&this->project->super_QMakeEvaluator,&pvar);
        ProString::toQString((QString *)local_f8,(ProString *)local_88);
        fileFixify((QString *)local_c8,this,(QString *)local_f8,(FileFixifyTypes)0x4,false);
        qVar12 = local_1d8.size;
        pcVar4 = local_1d8.ptr;
        pDVar3 = local_1d8.d;
        local_1d8.d = (Data *)local_c8._0_8_;
        local_1d8.ptr = (char16_t *)local_c8._8_8_;
        local_c8._0_8_ = pDVar3;
        local_c8._8_8_ = pcVar4;
        local_1d8.size = local_b8._0_8_;
        local_b8._0_8_ = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        cVar9 = QString::endsWith((QString *)&local_1d8,0x26bbd0);
        if (cVar9 == '\0') {
          QString::append((QString *)&local_1d8);
        }
      }
      local_1f8.d = (Data *)0x0;
      local_1f8.ptr = (QString *)0x0;
      local_1f8.size = 0;
      local_218.d = (Data *)0x0;
      local_218.ptr = (QString *)0x0;
      local_218.size = 0;
      local_238.d = (Data *)0x0;
      local_238.ptr = (QString *)0x0;
      local_238.size = 0;
      local_258.size = -0x5555555555555556;
      local_258.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_258.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
      pQVar27 = pMVar22->project;
      local_c8._8_8_ = ".extra";
      local_c8._0_8_ = this_02.d.ptr;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_c8);
      pPVar13 = QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
      local_258.d = (pPVar13->super_QList<ProString>).d.d;
      local_258.ptr = (pPVar13->super_QList<ProString>).d.ptr;
      local_258.size = (pPVar13->super_QList<ProString>).d.size;
      if (local_258.d != (Data *)0x0) {
        LOCK();
        ((local_258.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_258.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if (local_258.size == 0) {
        pQVar27 = pMVar22->project;
        local_c8._8_8_ = ".commands";
        local_c8._0_8_ = this_02.d.ptr;
        ProString::ProString<ProString_const&,char_const(&)[10]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)local_c8);
        other = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
        QArrayDataPointer<ProString>::operator=(&local_258,other);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        if (local_258.size != 0) goto LAB_00148e8e;
        bVar8 = true;
      }
      else {
LAB_00148e8e:
        ProStringList::join((QString *)local_88,(ProStringList *)&local_258,(QChar)0x20);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_218,(QString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        bVar8 = false;
      }
      pQVar27 = pMVar22->project;
      local_418.super_ProString.m_string.d.ptr = L".files";
      local_418.super_ProString.m_string.d.d = (Data *)this_02.d.ptr;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_418);
      pPVar13 = QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
      local_270.d = (pPVar13->super_QList<ProString>).d.d;
      local_270.ptr = (pPVar13->super_QList<ProString>).d.ptr;
      local_270.size = (pPVar13->super_QList<ProString>).d.size;
      if (local_270.d != (Data *)0x0) {
        LOCK();
        ((local_270.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_270.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::QString((QString *)local_f8,"");
      l.super_QList<ProString>.d.ptr._0_7_ = in_stack_fffffffffffffae0;
      l.super_QList<ProString>.d.d = (Data *)pMVar22;
      l.super_QList<ProString>.d.ptr._7_1_ = in_stack_fffffffffffffae7;
      l.super_QList<ProString>.d.size = (qsizetype)this_02.d.ptr;
      this = pMVar22;
      findFilesInVPATH((ProStringList *)local_c8,pMVar22,l,(uchar)&local_270,(QString *)0x4);
      QArrayDataPointer<ProString>::operator=(&local_258,(QArrayDataPointer<ProString> *)local_c8);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_270);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      ProStringList::toQStringList((QStringList *)local_c8,(ProStringList *)&local_258);
      fileFixify((QStringList *)local_88,pMVar22,(QStringList *)local_c8,(FileFixifyTypes)0x4,true);
      QArrayDataPointer<QString>::operator=(&local_1f8,(QArrayDataPointer<QString> *)local_88);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_c8);
      if (local_1f8.size == 0) {
        local_f8._0_8_ = (QMakeProject *)0x0;
        local_f8._8_8_ = (QMakeProject *)0x0;
        local_e8._0_8_ = (QMakeProject *)0x0;
        if (!bVar8) goto LAB_0014ab4f;
        ProString::toQString((QString *)local_c8,(ProString *)this_02.d.ptr);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x12])
                  ((ProString *)local_88,this,(QString *)local_c8);
      }
      else {
        local_288.size = -0x5555555555555556;
        local_288.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_288.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar27 = this->project;
        local_f8._8_8_ = ".base";
        local_f8._0_8_ = this_02.d.ptr;
        ProString::ProString<ProString_const&,char_const(&)[6]>
                  ((ProString *)local_c8,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)local_f8);
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar27->super_QMakeEvaluator,(ProKey *)local_c8);
        ProString::toQString((QString *)&local_288,(ProString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        if ((QMakeProject *)local_288.size != (QMakeProject *)0x0) {
          Option::fixPathToTargetOS((QString *)local_88,(QString *)&local_288,false,true);
          qVar12 = local_288.size;
          pcVar4 = local_288.ptr;
          pDVar3 = local_288.d;
          local_288.d = (Data *)local_88._0_8_;
          local_288.ptr = (char16_t *)local_88._8_8_;
          local_88._0_8_ = pDVar3;
          local_88._8_8_ = pcVar4;
          local_288.size = (qsizetype)local_78[0].d;
          local_78[0].d = (Data *)qVar12;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          cVar9 = QString::endsWith((QString *)&local_288,0x26bbd0);
          if (cVar9 == '\0') {
            QString::append((QString *)&local_288);
          }
        }
        in = QList<QString>::begin((QList<QString> *)&local_1f8);
        while( true ) {
          iVar14 = QList<QString>::end((QList<QString> *)&local_1f8);
          if (in.i == iVar14.i) break;
          local_2a8.size = -0x5555555555555556;
          local_2a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_2a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          Option::fixPathToTargetOS((QString *)&local_2a8,in.i,false,false);
          local_2b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_2c8 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          pQStack_2c0 = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
          qmake_getpwd();
          local_2e0.d = local_2a8.d;
          local_2e0.ptr = local_2a8.ptr;
          local_2e0.size = local_2a8.size;
          if ((Data *)local_2a8.d != (Data *)0x0) {
            LOCK();
            ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          qVar12 = QString::lastIndexOf((QString *)&local_2e0,&Option::dir_sep,CaseSensitive);
          pMVar22 = this;
          if ((int)qVar12 != -1) {
            QString::left((QString *)local_88,(QString *)&local_2e0,(long)((int)qVar12 + 1));
            QVar2.d = local_2b8.d;
            pQVar27 = pQStack_2c0;
            auVar1 = local_2c8;
            local_2c8 = (undefined1  [8])local_88._0_8_;
            pQStack_2c0 = (QMakeProject *)local_88._8_8_;
            local_88._0_8_ = auVar1;
            local_88._8_8_ = pQVar27;
            local_2b8.d = (Data *)local_78[0].d;
            local_78[0].d = (Data *)QVar2.d;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QString::remove((longlong)&local_2e0,0);
            pMVar22 = this;
          }
          cVar9 = QString::endsWith((QString *)local_2c8,0x26bbd0);
          if (cVar9 == '\0') {
            QString::append((QString *)local_2c8);
          }
          local_2f8.d = local_1d8.d;
          local_2f8.ptr = local_1d8.ptr;
          local_2f8.size = local_1d8.size;
          if ((QMakeProject *)local_1d8.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_1d8.d)->super_QArrayData)->m_caller
                     )->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_1d8.d)->super_QArrayData)->m_caller)->d + 1;
            UNLOCK();
          }
          if ((QMakeProject *)local_288.size != (QMakeProject *)0x0) {
            cVar9 = QString::startsWith((QString *)local_2c8,(CaseSensitivity)&local_288);
            if (cVar9 == '\0') {
              QString::toLocal8Bit((QByteArray *)local_88,(QString *)&local_2a8);
              pQVar27 = (QMakeProject *)local_88._8_8_;
              if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
                pQVar27 = (QMakeProject *)&QByteArray::_empty;
              }
              ProString::toQString((QString *)local_f8,(ProString *)this_02.d.ptr);
              QString::toLocal8Bit((QByteArray *)local_c8,(QString *)local_f8);
              pQVar24 = (QString *)local_c8._8_8_;
              if ((QString *)local_c8._8_8_ == (QString *)0x0) {
                pQVar24 = (QString *)&QByteArray::_empty;
              }
              QString::toLocal8Bit((QByteArray *)&local_418,(QString *)&local_288);
              pPVar23 = (ProString *)local_418.super_ProString.m_string.d.ptr;
              if ((ProString *)local_418.super_ProString.m_string.d.ptr == (ProString *)0x0) {
                pPVar23 = (ProString *)&QByteArray::_empty;
              }
              warn_msg(WarnLogic,"File %s in install rule %s does not start with base %s",pQVar27,
                       pQVar24,pPVar23);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_418);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_f8);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_88);
            }
            else {
              local_b8._0_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
              local_c8._0_8_ =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )0xaaaaaaaaaaaaaaaa;
              local_c8._8_8_ = (QString *)0xaaaaaaaaaaaaaaaa;
              QString::mid((longlong)local_c8,(longlong)local_2c8);
              QString::append((QString *)&local_2f8);
              pMVar21 = pMVar22;
              if (((QMakeProject *)local_b8._0_8_ != (QMakeProject *)0x0) &&
                 (bVar8 = QHash<QString,_QHashDummyValue>::contains
                                    ((QHash<QString,_QHashDummyValue> *)(local_168 + 8),
                                     (QString *)local_c8), pMVar21 = pMVar22, !bVar8)) {
                QSet<QString>::insert((QSet<QString> *)local_88,(QString *)(local_168 + 8));
                local_e8._0_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
                local_f8._0_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
                local_f8._8_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
                pMVar21 = pMVar22;
                fileFixify((QString *)local_f8,pMVar22,(QString *)&local_2f8,(FileFixifyTypes)0x4,
                           false);
                pMVar19 = (MakefileGenerator *)0x1;
                QString::chop((longlong)local_f8);
                filePrefixRoot((QString *)&local_418,pMVar19,(QString *)&local_1b8,
                               (QString *)local_f8);
                mkdir_p_asstring((QString *)local_88,pMVar22,(QString *)&local_418,true);
                QList<QString>::emplaceBack<QString>
                          ((QList<QString> *)&local_218,(QString *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_418);
                lVar26 = (long)(int)local_1d8.size;
                while( true ) {
                  if (local_2f8.size <= lVar26) break;
                  if ((Option::dir_sep.d.size == 1) &&
                     (*Option::dir_sep.d.ptr ==
                      *(char16_t *)((long)&(((QString *)local_2f8.ptr)->d).d + lVar26 * 2))) {
                    local_418.super_ProString.m_string.d.size = -0x5555555555555556;
                    local_418.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_418.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                    QString::left((QString *)&local_418,(QString *)&local_2f8,lVar26);
                    bVar8 = QHash<QString,_QHashDummyValue>::contains
                                      ((QHash<QString,_QHashDummyValue> *)local_168,
                                       (QString *)&local_418);
                    if (!bVar8) {
                      QSet<QString>::insert((QSet<QString> *)local_88,(QString *)local_168);
                      pMVar22 = pMVar21;
                      pMVar19 = pMVar21;
                      fileFixify((QString *)local_88,pMVar21,(QString *)&local_418,
                                 (FileFixifyTypes)0x4,false);
                      uVar7 = local_e8._0_8_;
                      uVar6 = local_f8._8_8_;
                      uVar5 = local_f8._0_8_;
                      local_f8._0_8_ = local_88._0_8_;
                      local_f8._8_8_ = local_88._8_8_;
                      local_88._0_8_ = uVar5;
                      local_88._8_8_ = uVar6;
                      local_e8._0_8_ = local_78[0].d;
                      local_78[0].d = (Data *)uVar7;
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_88);
                      filePrefixRoot((QString *)local_358,pMVar22,(QString *)&local_1b8,
                                     (QString *)local_f8);
                      (*(pMVar21->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                                (&local_338,pMVar21,local_358);
                      local_78[0].ptr = (char16_t *)local_338.size;
                      local_78[0].d = (Data *)local_338.ptr;
                      local_88._8_8_ = local_338.d;
                      local_88._0_8_ = "-$(DEL_DIR) ";
                      local_338.d = (Data *)0x0;
                      local_338.ptr = (QString *)0x0;
                      local_338.size = 0;
                      QStringBuilder<const_char_(&)[13],_QString>::convertTo<QString>
                                ((QString *)&local_318,
                                 (QStringBuilder<const_char_(&)[13],_QString> *)local_88);
                      QList<QString>::emplaceBack<QString>
                                ((QList<QString> *)&local_238,(QString *)&local_318);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)(local_88 + 8));
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_338);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_358);
                      pMVar21 = pMVar19;
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_418);
                  }
                  lVar26 = lVar26 + 1;
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_f8);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
              pMVar22 = pMVar21;
            }
          }
          ProKey::ProKey((ProKey *)local_88,"TARGET");
          this = pMVar22;
          (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    ((QArrayDataPointer<char16_t> *)local_f8,pMVar22,
                     (QArrayDataPointer<char16_t> *)local_88);
          fileFixify((QString *)local_c8,pMVar22,(QString *)local_f8,(FileFixifyTypes)0x4,true);
          bVar8 = comparesEqual((QString *)&local_2a8,(QString *)local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          pcVar20 = "nostrip";
          in_stack_fffffffffffffae7 =
               ProStringList::contains((ProStringList *)vector,"nostrip",CaseSensitive);
          if (bVar8) {
LAB_001497c1:
            _fi = (Data *)0xaaaaaaaaaaaaaaaa;
            local_388.d = local_2a8.d;
            local_388.ptr = local_2a8.ptr;
            local_388.size = local_2a8.size;
            if ((Data *)local_2a8.d != (Data *)0x0) {
              LOCK();
              ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            file_00.d.ptr._0_7_ = in_stack_fffffffffffffae0;
            file_00.d.d = (Data *)this;
            file_00.d.ptr._7_1_ = in_stack_fffffffffffffae7;
            file_00.d.size = (qsizetype)this_02.d.ptr;
            fileInfo((MakefileGenerator *)&fi,file_00);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_388);
            local_318.size = -0x5555555555555556;
            local_318.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_318.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            filePrefixRoot((QString *)&local_318,(MakefileGenerator *)pcVar20,(QString *)&local_1b8,
                           (QString *)&local_2f8);
            cVar9 = QString::endsWith((QString *)&local_318,0x26bbd0);
            if (cVar9 == '\0') {
              QString::append((QString *)&local_318);
            }
            QFileInfo::fileName();
            QString::append((QString *)&local_318);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            local_338.size = 0;
            local_338.d = (Data *)0x0;
            local_338.ptr = (QString *)0x0;
            pcVar20 = "$(QINSTALL_PROGRAM)";
            if (!bVar8) {
              cVar9 = QFileInfo::isDir();
              if (cVar9 == '\0') {
                cVar9 = QFileInfo::isExecutable();
                pcVar20 = "$(QINSTALL_PROGRAM)";
                if (cVar9 != '\0') goto LAB_001498eb;
              }
              pcVar20 = "$(QINSTALL)";
            }
LAB_001498eb:
            pQVar15 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>(pcVar20);
            QString::operator=((QString *)&local_338,pQVar15);
            pMVar22 = this;
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                      (&local_418,this,&local_2a8);
            local_e8._8_8_ = local_418.super_ProString.m_string.d.size;
            local_e8._0_8_ = local_418.super_ProString.m_string.d.ptr;
            local_f8._8_8_ = local_418.super_ProString.m_string.d.d;
            local_f8._0_8_ = " ";
            local_418.super_ProString.m_string.d.d = (Data *)0x0;
            local_418.super_ProString.m_string.d.ptr = (char16_t *)0x0;
            local_418.super_ProString.m_string.d.size = 0;
            QStringBuilder<const_char_(&)[2],_QString>::QStringBuilder
                      ((QStringBuilder<const_char_(&)[2],_QString> *)local_c8,
                       (QStringBuilder<const_char_(&)[2],_QString> *)local_f8);
            local_a8 = (Data *)0x21fe9e;
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                      ((QMakeProject *)local_358,this,&local_318);
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                              *)local_88,
                             (QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                              *)local_c8,(QString *)local_358);
            ::operator+=((QString *)&local_338,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                          *)local_88);
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                               *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_358);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_f8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_418);
            local_348 = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
            local_358 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
            pDStack_350 = (Data *)0xaaaaaaaaaaaaaaaa;
            ProKey::ProKey((ProKey *)local_88,"QMAKE_INSTALL_REPLACE");
            QFileInfo::fileName();
            createSedArgs((QString *)local_358,this,(ProKey *)local_88,(QString *)local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            if (local_348 == (QMakeLocalFileName *)0x0) {
              QList<QString>::emplaceBack<QString_const&>
                        ((QList<QString> *)&local_218,(QString *)&local_338);
            }
            else {
              pMVar21 = pMVar22;
              (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&local_3a8,pMVar22,&local_2a8);
              local_d0 = (QMakeProject *)local_3a8.size;
              pQStack_d8 = (QMakeProject *)local_3a8.ptr;
              local_e8._8_8_ = local_3a8.d;
              local_f8._0_8_ = "$(SED) ";
              local_e8[0] = 0x20;
              local_3a8.d = (Data *)0x0;
              local_3a8.ptr = (char16_t *)0x0;
              local_3a8.size = 0;
              local_f8._8_8_ = (QMakeProject *)local_358;
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
                                *)local_c8,
                               (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
                                *)local_f8);
              local_98 = (char (*) [4])0x21d66e;
              (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        ((QArrayDataPointer<char16_t> *)local_3c8,pMVar22,&local_318);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                                *)local_88,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
                                *)local_c8,(QString *)local_3c8);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
              ::convertTo<QString>
                        ((QString *)&local_418,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                          *)local_88);
              QList<QString>::emplaceBack<QString>
                        ((QList<QString> *)&local_218,(QString *)&local_418);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_418);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                                 *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_3c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_b8 + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_e8 + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
              pMVar22 = pMVar21;
            }
            if (in_stack_fffffffffffffae7 == '\0') {
              pQVar27 = pMVar22->project;
              QString::QString((QString *)local_c8,"debug_info");
              bVar8 = QMakeProject::isActiveConfig(pQVar27,(QString *)local_c8,false);
              this_00 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
                         *)local_c8;
              if (!bVar8) {
                pQVar27 = pMVar22->project;
                QString::QString((QString *)local_f8,"nostrip");
                bVar8 = QMakeProject::isActiveConfig(pQVar27,(QString *)local_f8,false);
                if (((bVar8) || (cVar9 = QFileInfo::isDir(), cVar9 != '\0')) ||
                   (cVar9 = QFileInfo::isExecutable(), cVar9 == '\0')) {
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_f8);
                }
                else {
                  pQVar27 = pMVar22->project;
                  ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
                  bVar8 = QMakeProject::isEmpty(pQVar27,(ProKey *)local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_c8);
                  if (bVar8) goto LAB_0014a920;
                  QString::QString((QString *)local_3c8,"-");
                  ProKey::ProKey(&local_418,"QMAKE_STRIP");
                  pMVar19 = pMVar22;
                  (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                            (&local_3e0,pMVar22,&local_418);
                  QStringBuilder<QString,_QString>::QStringBuilder
                            ((QStringBuilder<QString,_QString> *)local_f8,(QString *)local_3c8,
                             (QString *)&local_3e0);
                  QStringBuilder<QString,_QString>::QStringBuilder
                            ((QStringBuilder<QString,_QString> *)local_c8,
                             (QStringBuilder<QString,_QString> *)local_f8);
                  local_98 = (char (*) [4])0x21fe9e;
                  local_4b0.d = (Data *)&local_2f8;
                  local_4b0.ptr = (char16_t *)&local_2e0;
                  QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                            ((QString *)&local_478,
                             (QStringBuilder<QString_&,_QString_&> *)&local_4b0);
                  pMVar21 = pMVar22;
                  fileFixify((QString *)&local_460,pMVar22,(QString *)&local_478,
                             (FileFixifyTypes)0x4,false);
                  filePrefixRoot((QString *)&local_448,pMVar21,(QString *)&local_1b8,
                                 (QString *)&local_460);
                  (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            ((QArrayDataPointer<char16_t> *)local_430,pMVar22,&local_448);
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                    *)local_88,
                                   (QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>
                                    *)local_c8,(QString *)local_430);
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                  ::convertTo<QString>
                            ((QString *)&local_3a8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                              *)local_88);
                  QList<QString>::emplaceBack<QString>
                            ((QList<QString> *)&local_218,(QString *)&local_3a8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                     *)local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_430);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_460);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_478);
                  QStringBuilder<QString,_QString>::~QStringBuilder
                            ((QStringBuilder<QString,_QString> *)local_c8);
                  QStringBuilder<QString,_QString>::~QStringBuilder
                            ((QStringBuilder<QString,_QString> *)local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_418);
                  this_00 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
                             *)local_3c8;
                  pMVar22 = pMVar19;
                }
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)this_00);
            }
LAB_0014a920:
            local_3e0.d = (Data *)&local_2f8;
            local_3e0.ptr = (char16_t *)&local_2e0;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      ((QString *)local_3c8,(QStringBuilder<QString_&,_QString_&> *)&local_3e0);
            pMVar21 = pMVar22;
            this = pMVar22;
            fileFixify((QString *)&local_3a8,pMVar22,(QString *)local_3c8,(FileFixifyTypes)0x4,false
                      );
            filePrefixRoot((QString *)&local_418,pMVar21,(QString *)&local_1b8,(QString *)&local_3a8
                          );
            (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                      ((QArrayDataPointer<char16_t> *)local_f8,pMVar22,
                       (QArrayDataPointer<char16_t> *)&local_418);
            local_78[0].size = local_e8._0_8_;
            local_78[0].ptr = (char16_t *)local_f8._8_8_;
            local_78[0].d = (Data *)local_f8._0_8_;
            local_88._0_8_ = local_118;
            local_88._8_8_ = " ";
            local_f8._0_8_ = (QMakeProject *)0x0;
            local_f8._8_8_ = (QMakeProject *)0x0;
            local_e8._0_8_ = (QMakeProject *)0x0;
            QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
            convertTo<QString>((QString *)local_c8,
                               (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                *)local_88);
            QList<QString>::emplaceBack<QString>((QList<QString> *)&local_238,(QString *)local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_418);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_3c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_358);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_338);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
            QFileInfo::~QFileInfo(&fi);
          }
          else {
            local_370._0_8_ = local_2a8.d;
            local_370._8_8_ = local_2a8.ptr;
            local_370._16_8_ = local_2a8.size;
            if ((Data *)local_2a8.d != (Data *)0x0) {
              LOCK();
              ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_2a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            file.d.ptr._0_7_ = in_stack_fffffffffffffae0;
            file.d.d = (Data *)this;
            file.d.ptr._7_1_ = (bool)in_stack_fffffffffffffae7;
            file.d.size = (qsizetype)this_02.d.ptr;
            pcVar20 = (char *)local_370;
            bVar10 = exists(this,file);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_370);
            if (bVar10) goto LAB_001497c1;
            local_318.size = -0x5555555555555556;
            local_318.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_318.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            Option::normalizePath((QString *)&local_318,(QString *)local_2c8,true,true);
            local_338.size = -0x5555555555555556;
            local_338.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_338.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
            QDir::QDir((QDir *)local_c8,(QString *)&local_318);
            QList<QString>::QList<QString,void>((QList<QString> *)local_88,(QString *)&local_2e0);
            QDir::entryList(&local_338,
                            (QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                             *)local_c8,
                            (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                             *)local_88);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
            QDir::~QDir((QDir *)local_c8);
            pcVar20 = "no_check_exist";
            bVar8 = ProStringList::contains((ProStringList *)vector,"no_check_exist",CaseSensitive);
            if ((bVar8) && ((QMakeProject *)local_338.size == (QMakeProject *)0x0)) {
              local_418.super_ProString.m_string.d.size = -0x5555555555555556;
              local_418.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_418.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              filePrefixRoot((QString *)&local_418,(MakefileGenerator *)pcVar20,
                             (QString *)&local_1b8,(QString *)&local_2f8);
              cVar9 = QString::endsWith((QString *)&local_418,0x26bbd0);
              pMVar22 = this;
              if (cVar9 == '\0') {
                QString::append((QString *)&local_418);
                pMVar22 = this;
              }
              QString::append((QString *)&local_418);
              local_358 = (undefined1  [8])0x0;
              pDStack_350 = (Data *)0x0;
              local_348 = (QMakeLocalFileName *)0x0;
              bVar8 = ProStringList::contains((ProStringList *)vector,"executable",CaseSensitive);
              pcVar20 = "$(QINSTALL)";
              if (bVar8) {
                pcVar20 = "$(QINSTALL_PROGRAM)";
              }
              pQVar15 = (QLatin1String *)QtPrivate::lengthHelperPointer<char>(pcVar20);
              QString::operator=((QString *)local_358,pQVar15);
              this = pMVar22;
              (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&local_3a8,pMVar22,&local_2a8);
              local_e8._8_8_ = local_3a8.size;
              local_e8._0_8_ = local_3a8.ptr;
              local_f8._8_8_ = local_3a8.d;
              local_f8._0_8_ = " ";
              local_3a8.d = (Data *)0x0;
              local_3a8.ptr = (char16_t *)0x0;
              local_3a8.size = 0;
              QStringBuilder<const_char_(&)[2],_QString>::QStringBuilder
                        ((QStringBuilder<const_char_(&)[2],_QString> *)local_c8,
                         (QStringBuilder<const_char_(&)[2],_QString> *)local_f8);
              local_a8 = (Data *)0x21fe9e;
              (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        ((QArrayDataPointer<char16_t> *)local_3c8,pMVar22,&local_418);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88,
                               (QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                                *)local_c8,(QString *)local_3c8);
              ::operator+=((QString *)local_358,
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                            *)local_88);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                 *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_3c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_f8 + 8));
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
              QList<QString>::emplaceBack<QString_const&>
                        ((QList<QString> *)&local_218,(QString *)local_358);
              local_430._0_8_ = &local_2f8;
              local_430._8_8_ = &local_2e0;
              QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                        ((QString *)&local_3e0,(QStringBuilder<QString_&,_QString_&> *)local_430);
              pMVar21 = pMVar22;
              fileFixify((QString *)local_3c8,pMVar22,(QString *)&local_3e0,(FileFixifyTypes)0x4,
                         false);
              filePrefixRoot((QString *)&local_3a8,pMVar21,(QString *)&local_1b8,
                             (QString *)local_3c8);
              (*(pMVar22->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (local_f8,pMVar22,&local_3a8);
              local_78[0].size = local_e8._0_8_;
              local_78[0].ptr = (char16_t *)local_f8._8_8_;
              local_78[0].d = (Data *)local_f8._0_8_;
              local_88._0_8_ = local_118;
              local_88._8_8_ = " ";
              local_f8._0_8_ = (QMakeProject *)0x0;
              local_f8._8_8_ = (QMakeProject *)0x0;
              local_e8._0_8_ = (QMakeProject *)0x0;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
              convertTo<QString>((QString *)local_c8,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                  *)local_88);
              QList<QString>::emplaceBack<QString>((QList<QString> *)&local_238,(QString *)local_c8)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_f8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_3c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_358);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_418);
            }
            local_500 = 0x10;
            pQVar27 = (QMakeProject *)0x0;
            while( true ) {
              if ((ulong)local_338.size <= pQVar27) break;
              local_348 = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
              local_358 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
              pDStack_350 = (Data *)0xaaaaaaaaaaaaaaaa;
              pQVar16 = QList<QString>::data((QList<QString> *)&local_338);
              local_358 = *(undefined1 (*) [8])((long)pQVar16 + local_500 + -0x10);
              pDStack_350 = *(Data **)((long)pQVar16 + local_500 + -8);
              local_348 = *(QMakeLocalFileName **)((long)&(pQVar16->d).d + local_500);
              if (local_358 != (undefined1  [8])0x0) {
                LOCK();
                (((Data *)local_358)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = (((Data *)local_358)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_3e0.d = (Data *)&local_2f8;
              local_3e0.ptr = (char16_t *)local_358;
              QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                        ((QString *)local_3c8,(QStringBuilder<QString_&,_QString_&> *)&local_3e0);
              pMVar22 = this;
              pMVar21 = this;
              fileFixify((QString *)&local_3a8,this,(QString *)local_3c8,(FileFixifyTypes)0x4,false)
              ;
              filePrefixRoot((QString *)&local_418,pMVar22,(QString *)&local_1b8,
                             (QString *)&local_3a8);
              (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        ((QArrayDataPointer<char16_t> *)local_f8,this,&local_418);
              local_78[0].size = local_e8._0_8_;
              local_78[0].ptr = (char16_t *)local_f8._8_8_;
              local_78[0].d = (Data *)local_f8._0_8_;
              local_88._0_8_ = local_118;
              local_88._8_8_ = " ";
              local_f8._0_8_ = (Data *)0x0;
              local_f8._8_8_ = (Location *)0x0;
              local_e8._0_8_ = (Data *)0x0;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::
              convertTo<QString>((QString *)local_c8,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>
                                  *)local_88);
              QList<QString>::emplaceBack<QString>((QList<QString> *)&local_238,(QString *)local_c8)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(local_78);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_f8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_418);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_3c8);
              _fi_1 = (_func_int **)0xaaaaaaaaaaaaaaaa;
              local_88._0_8_ = local_2c8;
              local_88._8_8_ = (QMakeProject *)local_358;
              QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                        ((QString *)&local_498,(QStringBuilder<QString_&,_QString_&> *)local_88);
              file_01.d.ptr._0_7_ = in_stack_fffffffffffffae0;
              file_01.d.d = (Data *)pMVar21;
              file_01.d.ptr._7_1_ = in_stack_fffffffffffffae7;
              file_01.d.size = (qsizetype)this_02.d.ptr;
              fileInfo((MakefileGenerator *)&fi_1,file_01);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_498);
              local_3a8.size = -0x5555555555555556;
              local_3a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_3a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              fileFixify((QString *)local_88,this,(QString *)&local_2f8,(FileFixifyTypes)0x4,false);
              filePrefixRoot((QString *)&local_3a8,this,(QString *)&local_1b8,(QString *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              cVar9 = QString::endsWith((QString *)&local_3a8,0x26bbd0);
              if (cVar9 == '\0') {
                QString::append((QString *)&local_3a8);
              }
              QFileInfo::fileName();
              QString::append((QString *)&local_3a8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              local_3c8._16_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
              local_3c8._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
              local_3c8._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
              pQVar17 = (QMakeProject *)QtPrivate::lengthHelperPointer<char>("$(QINSTALL) ");
              local_430._0_8_ = local_2c8;
              local_430._8_8_ = local_358;
              this = pMVar21;
              escapeFilePath<QString&,QString&>
                        ((QString *)&local_418,pMVar21,
                         (QStringBuilder<QString_&,_QString_&> *)local_430);
              pQStack_d8 = (QMakeProject *)local_418.super_ProString.m_string.d.size;
              local_e8._8_8_ = local_418.super_ProString.m_string.d.ptr;
              local_e8._0_8_ = local_418.super_ProString.m_string.d.d;
              local_f8._8_8_ = "$(QINSTALL) ";
              local_418.super_ProString.m_string.d.d = (Data *)0x0;
              local_418.super_ProString.m_string.d.ptr = (char16_t *)0x0;
              local_418.super_ProString.m_string.d.size = 0;
              a_ = (QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)local_c8;
              local_f8._0_8_ = pQVar17;
              QStringBuilder<QLatin1String,_QString>::QStringBuilder
                        ((QStringBuilder<QLatin1String,_QString> *)a_,
                         (QStringBuilder<QLatin1String,_QString> *)local_f8);
              local_a0 = L" ";
              (*(pMVar21->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&local_3e0,pMVar21,&local_3a8);
              QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
              ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88,
                               (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>
                                *)a_,(QString *)&local_3e0);
              QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
              ::convertTo<QString>
                        ((QString *)local_3c8,
                         (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                          *)local_88);
              QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                 *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_418);
              QList<QString>::emplaceBack<QString_const&>
                        ((QList<QString> *)&local_218,(QString *)local_3c8);
              if (in_stack_fffffffffffffae7 == '\0') {
                pQVar17 = this->project;
                QString::QString((QString *)a_,"debug_info");
                bVar8 = QMakeProject::isActiveConfig(pQVar17,(QString *)a_,false);
                if (!bVar8) {
                  pQVar17 = this->project;
                  QString::QString((QString *)local_f8,"nostrip");
                  bVar8 = QMakeProject::isActiveConfig(pQVar17,(QString *)local_f8,false);
                  if (((bVar8) || (cVar9 = QFileInfo::isDir(), cVar9 != '\0')) ||
                     (cVar9 = QFileInfo::isExecutable(), cVar9 == '\0')) {
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_f8);
                  }
                  else {
                    pQVar17 = this->project;
                    ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
                    bVar8 = QMakeProject::isEmpty(pQVar17,(ProKey *)local_88);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_88);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_f8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)a_);
                    if (bVar8) goto LAB_0014a8a1;
                    QString::QString((QString *)local_430,"-");
                    ProKey::ProKey(&local_418,"QMAKE_STRIP");
                    pMVar21 = this;
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                              (&local_448,this,(QArrayDataPointer<char16_t> *)&local_418);
                    QStringBuilder<QString,_QString>::QStringBuilder
                              ((QStringBuilder<QString,_QString> *)local_f8,(QString *)local_430,
                               (QString *)&local_448);
                    QStringBuilder<QString,_QString>::QStringBuilder
                              ((QStringBuilder<QString,_QString> *)a_,
                               (QStringBuilder<QString,_QString> *)local_f8);
                    local_98 = (char (*) [4])0x21fe9e;
                    local_4d8.a = (QString *)&local_2f8;
                    local_4d8.b = (QString *)local_358;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              ((QString *)&fi,&local_4d8);
                    pMVar22 = this;
                    fileFixify((QString *)&local_4b0,this,(QString *)&fi,(FileFixifyTypes)0x4,false)
                    ;
                    filePrefixRoot((QString *)&local_478,pMVar22,(QString *)&local_1b8,
                                   (QString *)&local_4b0);
                    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                              (&local_460,this,&local_478);
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                    ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                      *)local_88,a_,(QString *)&local_460);
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                    ::convertTo<QString>
                              ((QString *)&local_3e0,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                *)local_88);
                    QList<QString>::emplaceBack<QString>
                              ((QList<QString> *)&local_218,(QString *)&local_3e0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                       *)local_88);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_460);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_478);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4b0);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&fi);
                    QStringBuilder<QString,_QString>::~QStringBuilder
                              ((QStringBuilder<QString,_QString> *)a_);
                    QStringBuilder<QString,_QString>::~QStringBuilder
                              ((QStringBuilder<QString,_QString> *)local_f8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_418);
                    a_ = (QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)
                         local_430;
                    this = pMVar21;
                  }
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)a_);
              }
LAB_0014a8a1:
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_3c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3a8);
              QFileInfo::~QFileInfo(&fi_1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_358);
              pQVar27 = (QMakeProject *)
                        ((long)&((DataPointer *)&(pQVar27->super_QMakeEvaluator).m_caller)->d + 1);
              local_500 = local_500 + 0x18;
            }
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_338);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2e0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
          in.i = in.i + 1;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
LAB_0014ab4f:
        local_e8._0_8_ = (QMakeProject *)0x0;
        local_f8._8_8_ = (QMakeProject *)0x0;
        local_f8._0_8_ = (QMakeProject *)0x0;
        QString::QString((QString *)local_c8,"\n\t");
        QListSpecialMethods<QString>::join
                  ((QString *)local_88,(QListSpecialMethods<QString> *)&local_218,
                   (QString *)local_c8);
      }
      uVar7 = local_e8._0_8_;
      uVar6 = local_f8._8_8_;
      uVar5 = local_f8._0_8_;
      local_f8._0_8_ = local_88._0_8_;
      local_f8._8_8_ = local_88._8_8_;
      local_88._0_8_ = uVar5;
      local_88._8_8_ = uVar6;
      local_e8._0_8_ = local_78[0].d;
      local_78[0].d = (Data *)uVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      local_418.super_ProString.m_string.d.size = -0x5555555555555556;
      local_418.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_418.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar27 = this->project;
      local_c8._8_8_ = ".uninstall";
      local_c8._0_8_ = this_02.d.ptr;
      ProString::ProString<ProString_const&,char_const(&)[11]>
                ((ProString *)local_88,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[11]> *)local_c8);
      pPVar13 = QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
      ProStringList::join((QString *)&local_418,pPVar13,(QChar)0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if ((ProString *)local_418.super_ProString.m_string.d.size != (ProString *)0x0) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_238,(QString *)&local_418);
      }
      str.d.ptr = this_02.d.ptr;
      if (((QMakeProject *)local_e8._0_8_ == (QMakeProject *)0x0) &&
         (qVar12 = QtPrivate::indexOf<ProString,char[14]>(vector,(char (*) [14])"dummy_install",0),
         str.d.ptr = this_02.d.ptr, qVar12 == -1)) {
        if (Option::debug_level != 0) {
          ProString::toLatin1((QByteArray *)local_88,(ProString *)this_02.d.ptr);
          pQVar27 = (QMakeProject *)local_88._8_8_;
          if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
            pQVar27 = (QMakeProject *)&QByteArray::_empty;
          }
          debug_msg_internal(1,"no definition for install %s: install target not created",pQVar27);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_88);
        }
      }
      else {
        this_02.d.ptr = str.d.ptr;
        if ((noBuild) ||
           (qVar12 = QtPrivate::indexOf<ProString,char[9]>(vector,(char (*) [9])"no_build",0),
           qVar12 != -1)) {
          pQVar18 = (QTextStream *)QTextStream::operator<<(t,"install_");
          pQVar18 = operator<<(pQVar18,(ProString *)str.d.ptr);
          QTextStream::operator<<(pQVar18,":");
        }
        else {
          pQVar27 = this->project;
          QString::QString((QString *)local_88,"build_all");
          bVar8 = QMakeProject::isActiveConfig(pQVar27,(QString *)local_88,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          pQVar18 = (QTextStream *)QTextStream::operator<<(t,"install_");
          pQVar18 = operator<<(pQVar18,(ProString *)str.d.ptr);
          if (bVar8) {
            pcVar20 = ": all";
          }
          else {
            pcVar20 = ": first";
          }
          str.d.ptr = this_02.d.ptr;
          QTextStream::operator<<(pQVar18,pcVar20);
          this_02.d.ptr = str.d.ptr;
        }
        pQVar27 = this->project;
        local_c8._8_8_ = ".depends";
        local_c8._0_8_ = str.d.ptr;
        ProString::ProString<ProString_const&,char_const(&)[9]>
                  ((ProString *)local_88,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)local_c8);
        pPVar13 = QMakeEvaluator::valuesRef(&pQVar27->super_QMakeEvaluator,(ProKey *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        lVar26 = (pPVar13->super_QList<ProString>).d.size;
        if (lVar26 != 0) {
          pQVar27 = (QMakeProject *)(pPVar13->super_QList<ProString>).d.ptr;
          for (pQVar17 = pQVar27;
              pQVar17 !=
              (QMakeProject *)
              ((DataPointer *)&(pQVar27->super_QMakeEvaluator).m_caller + lVar26 * 2);
              pQVar17 = (QMakeProject *)
                        &(pQVar17->super_QMakeEvaluator).m_locationStack.
                         super_QList<QMakeEvaluator::Location>.d.size) {
            local_b8._0_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
            local_c8._0_8_ =
                 (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )0xaaaaaaaaaaaaaaaa;
            local_c8._8_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
            local_288.ptr = L".target";
            local_288.d = (Data *)pQVar17;
            ProString::ProString<ProString_const&,char_const(&)[8]>
                      ((ProString *)local_88,
                       (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_288);
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                      ((QStringBuilder<QString,_const_ProString_&> *)local_c8,this,
                       (ProString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            if ((QMakeProject *)local_b8._0_8_ == (QMakeProject *)0x0) {
              ProString::toQString((QString *)local_88,(ProString *)pQVar17);
              uVar7 = local_b8._0_8_;
              uVar6 = local_c8._8_8_;
              uVar5 = local_c8._0_8_;
              local_c8._0_8_ = local_88._0_8_;
              local_c8._8_8_ = local_88._8_8_;
              local_88._0_8_ = uVar5;
              local_88._8_8_ = uVar6;
              local_b8._0_8_ = local_78[0].d;
              local_78[0].d = (Data *)uVar7;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
            }
            pQVar18 = (QTextStream *)QTextStream::operator<<(t," ");
            (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                      ((ProString *)local_88,this,
                       (QStringBuilder<QString,_const_ProString_&> *)local_c8);
            QTextStream::operator<<(pQVar18,(QString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            pQVar27 = (QMakeProject *)(pPVar13->super_QList<ProString>).d.ptr;
            lVar26 = (pPVar13->super_QList<ProString>).d.size;
          }
        }
        QTextStream::operator<<(t," FORCE\n\t");
        pPVar13 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,&pvar);
        pPVar23 = (pPVar13->super_QList<ProString>).d.ptr;
        for (this_01 = pPVar23; this_01 != pPVar23 + (pPVar13->super_QList<ProString>).d.size;
            this_01 = this_01 + 1) {
          local_78[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_88._0_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
          local_88._8_8_ = (QMakeProject *)0xaaaaaaaaaaaaaaaa;
          ProString::toQString((QString *)local_c8,this_01);
          pMVar22 = this;
          pMVar21 = this;
          fileFixify((QString *)local_88,this,(QString *)local_c8,(FileFixifyTypes)0x4,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          filePrefixRoot((QString *)&local_288,pMVar22,(QString *)&local_1b8,(QString *)local_88);
          mkdir_p_asstring((QString *)local_c8,this,(QString *)&local_288,true);
          pQVar18 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_c8);
          QTextStream::operator<<(pQVar18,"\n\t");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          pPVar23 = (pPVar13->super_QList<ProString>).d.ptr;
          this = pMVar21;
        }
        pQVar18 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_f8);
        pQVar18 = (QTextStream *)Qt::endl(pQVar18);
        Qt::endl(pQVar18);
        if (local_238.size != 0) {
          pQVar18 = (QTextStream *)QTextStream::operator<<(t,"uninstall_");
          pQVar18 = operator<<(pQVar18,(ProString *)this_02.d.ptr);
          QTextStream::operator<<(pQVar18,": FORCE");
          uVar25 = local_238.size;
          lVar26 = (local_238.size & 0xffffffffU) * 0x18;
          while( true ) {
            if ((int)uVar25 < 1) break;
            pQVar18 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
            QTextStream::operator<<(pQVar18,(QString *)((long)&local_238.ptr[-1].d.d + lVar26));
            uVar25 = (ulong)((int)uVar25 - 1);
            lVar26 = lVar26 + -0x18;
          }
          pcVar20 = "\n\t-$(DEL_DIR) ";
          pQVar18 = (QTextStream *)QTextStream::operator<<(t,"\n\t-$(DEL_DIR) ");
          filePrefixRoot((QString *)local_c8,(MakefileGenerator *)pcVar20,(QString *)&local_1b8,
                         (QString *)&local_1d8);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                    ((QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                      *)local_88,this,(QStringBuilder<QString,_const_ProString_&> *)local_c8);
          pQVar18 = (QTextStream *)QTextStream::operator<<(pQVar18,(QString *)local_88);
          QTextStream::operator<<(pQVar18," \n\n");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        }
        Qt::endl(t);
        qVar12 = QtPrivate::indexOf<ProString,char[19]>
                           (vector,(char (*) [19])"no_default_install",0);
        if (qVar12 == -1) {
          QString::QString((QString *)&local_288,"install_");
          local_b8._0_8_ = local_288.size;
          local_c8._8_8_ = local_288.ptr;
          local_c8._0_8_ = local_288.d;
          local_288.d = (Data *)0x0;
          local_288.ptr = (char16_t *)0x0;
          local_288.size = 0;
          local_b8._8_8_ = this_02.d.ptr;
          QStringBuilder<QString,_const_ProString_&>::QStringBuilder
                    ((QStringBuilder<QString,_const_ProString_&> *)local_88,
                     (QStringBuilder<QString,_const_ProString_&> *)local_c8);
          local_78[0].size = 0x21fe9e;
          ::operator+=((QString *)&local_138,
                       (QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                        *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
          if (local_238.size != 0) {
            local_88._0_8_ = "uninstall_";
            local_78[0].d = (Data *)0x21fe9e;
            local_88._8_8_ = this_02.d.ptr;
            ::operator+=((QString *)&local_158,
                         (QStringBuilder<QStringBuilder<const_char_(&)[11],_const_ProString_&>,_const_char_(&)[2]>
                          *)local_88);
          }
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_418);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_258);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_238);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_218);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pvar);
    this_02.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )&(((QMakeProject *)this_02.d.ptr)->super_QMakeEvaluator).m_locationStack.
            super_QList<QMakeEvaluator::Location>.d.size;
  } while( true );
}

Assistant:

void
MakefileGenerator::writeInstalls(QTextStream &t, bool noBuild)
{
    QString rm_dir_contents("-$(DEL_FILE)");
    if (!isWindowsShell()) //ick
        rm_dir_contents = "-$(DEL_FILE) -r";

    QString all_installs, all_uninstalls;
    QSet<QString> made_dirs, removed_dirs;
    const ProStringList &l = project->values("INSTALLS");
    for (ProStringList::ConstIterator it = l.begin(); it != l.end(); ++it) {
        const ProKey pvar(*it + ".path");
        const ProStringList &installConfigValues = project->values(ProKey(*it + ".CONFIG"));
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1 &&
           project->values(pvar).isEmpty()) {
            warn_msg(WarnLogic, "%s is not defined: install target not created\n", pvar.toLatin1().constData());
            continue;
        }

        bool do_default = true;
        const QString root = installRoot();
        QString dst;
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1) {
            dst = fileFixify(project->first(pvar).toQString(), FileFixifyAbsolute, false);
            if(!dst.endsWith(Option::dir_sep))
                dst += Option::dir_sep;
        }

        QStringList tmp, inst, uninst;
        //other
        ProStringList tmp2 = project->values(ProKey(*it + ".extra"));
        if (tmp2.isEmpty())
            tmp2 = project->values(ProKey(*it + ".commands")); //to allow compatible name
        if (!tmp2.isEmpty()) {
            do_default = false;
            inst << tmp2.join(' ');
        }
        //masks
        tmp2 = findFilesInVPATH(project->values(ProKey(*it + ".files")), VPATH_NoFixify);
        tmp = fileFixify(tmp2.toQStringList(), FileFixifyAbsolute);
        if(!tmp.isEmpty()) {
            do_default = false;
            QString base_path = project->first(ProKey(*it + ".base")).toQString();
            if (!base_path.isEmpty()) {
                base_path = Option::fixPathToTargetOS(base_path, false, true);
                if (!base_path.endsWith(Option::dir_sep))
                    base_path += Option::dir_sep;
            }
            for(QStringList::Iterator wild_it = tmp.begin(); wild_it != tmp.end(); ++wild_it) {
                QString wild = Option::fixPathToTargetOS((*wild_it), false, false);
                QString dirstr = qmake_getpwd(), filestr = wild;
                int slsh = filestr.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    dirstr = filestr.left(slsh+1);
                    filestr.remove(0, slsh+1);
                }
                if(!dirstr.endsWith(Option::dir_sep))
                    dirstr += Option::dir_sep;
                QString dst_dir = dst;
                if (!base_path.isEmpty()) {
                    if (!dirstr.startsWith(base_path)) {
                        warn_msg(WarnLogic, "File %s in install rule %s does not start with base %s",
                                            qPrintable(wild), qPrintable((*it).toQString()),
                                            qPrintable(base_path));
                    } else {
                        QString dir_sfx = dirstr.mid(base_path.size());
                        dst_dir += dir_sfx;
                        if (!dir_sfx.isEmpty() && !made_dirs.contains(dir_sfx)) {
                            made_dirs.insert(dir_sfx);
                            QString tmp_dst = fileFixify(dst_dir, FileFixifyAbsolute, false);
                            tmp_dst.chop(1);
                            inst << mkdir_p_asstring(filePrefixRoot(root, tmp_dst));
                            for (int i = dst.size(); i < dst_dir.size(); i++) {
                                if (dst_dir.at(i) == Option::dir_sep) {
                                    QString subd = dst_dir.left(i);
                                    if (!removed_dirs.contains(subd)) {
                                        removed_dirs.insert(subd);
                                        tmp_dst = fileFixify(subd, FileFixifyAbsolute, false);
                                        uninst << "-$(DEL_DIR) "
                                                  + escapeFilePath(filePrefixRoot(root, tmp_dst));
                                    }
                                }
                            }
                        }
                    }
                }
                bool is_target = (wild == fileFixify(var("TARGET"), FileFixifyAbsolute));
                const bool noStrip = installConfigValues.contains("nostrip");
                if(is_target || exists(wild)) { //real file or target
                    QFileInfo fi(fileInfo(wild));
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd;
                    if (is_target || (!fi.isDir() && fi.isExecutable()))
                       cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                       cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);

                    QString sedArgs = createSedArgs(ProKey("QMAKE_INSTALL_REPLACE"), fi.fileName());
                    if (!sedArgs.isEmpty())
                        inst << "$(SED) " + sedArgs + ' ' + escapeFilePath(wild) + " > "
                                        + escapeFilePath(dst_file);
                    else
                        inst << cmd;

                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false)));
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                    continue;
                }
                QString local_dirstr = Option::normalizePath(dirstr);
                QStringList files = QDir(local_dirstr).entryList(QStringList(filestr),
                                            QDir::NoDotAndDotDot | QDir::AllEntries);
                if (installConfigValues.contains("no_check_exist") && files.isEmpty()) {
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += filestr;
                    QString cmd;
                    if (installConfigValues.contains("executable"))
                        cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                        cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                }
                for(int x = 0; x < files.size(); x++) {
                    QString file = files[x];
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false))));
                    QFileInfo fi(fileInfo(dirstr + file));
                    QString dst_file = filePrefixRoot(root, fileFixify(dst_dir, FileFixifyAbsolute, false));
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd = QLatin1String("$(QINSTALL) ") +
                                  escapeFilePath(dirstr + file) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false)));
                }
            }
        }
        QString target;
        //default?
        if (do_default)
            target = defaultInstall((*it).toQString());
        else
            target = inst.join("\n\t");
        QString puninst = project->values(ProKey(*it + ".uninstall")).join(' ');
        if (!puninst.isEmpty())
            uninst << puninst;

        if (!target.isEmpty() || installConfigValues.indexOf("dummy_install") != -1) {
            if (noBuild || installConfigValues.indexOf("no_build") != -1)
                t << "install_" << (*it) << ":";
            else if(project->isActiveConfig("build_all"))
                t << "install_" << (*it) << ": all";
            else
                t << "install_" << (*it) << ": first";
            const ProStringList &deps = project->values(ProKey(*it + ".depends"));
            if(!deps.isEmpty()) {
                for (ProStringList::ConstIterator dep_it = deps.begin(); dep_it != deps.end(); ++dep_it) {
                    QString targ = var(ProKey(*dep_it + ".target"));
                    if(targ.isEmpty())
                        targ = (*dep_it).toQString();
                    t << " " << escapeDependencyPath(targ);
                }
            }
            t << " FORCE\n\t";
            const ProStringList &dirs = project->values(pvar);
            for (ProStringList::ConstIterator pit = dirs.begin(); pit != dirs.end(); ++pit) {
                QString tmp_dst = fileFixify((*pit).toQString(), FileFixifyAbsolute, false);
                t << mkdir_p_asstring(filePrefixRoot(root, tmp_dst)) << "\n\t";
            }
            t << target << Qt::endl << Qt::endl;
            if(!uninst.isEmpty()) {
                t << "uninstall_" << (*it) << ": FORCE";
                for (int i = uninst.size(); --i >= 0; )
                    t << "\n\t" << uninst.at(i);
                t << "\n\t-$(DEL_DIR) " << escapeFilePath(filePrefixRoot(root, dst)) << " \n\n";
            }
            t << Qt::endl;

            if (installConfigValues.indexOf("no_default_install") == -1) {
                all_installs += QString("install_") + (*it) + " ";
                if(!uninst.isEmpty())
                    all_uninstalls += "uninstall_" + (*it) + " ";
            }
        }   else {
            debug_msg(1, "no definition for install %s: install target not created",(*it).toLatin1().constData());
        }
    }
    t << "install:" << depVar("INSTALLDEPS") << ' ' << all_installs
      << " FORCE\n\nuninstall: " << all_uninstalls << depVar("UNINSTALLDEPS")
      << " FORCE\n\n";
}